

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectDeclaration_Parameter.cpp
# Opt level: O1

ostream * psy::C::operator<<(ostream *os,ParameterDeclarationSymbol *param)

{
  Lexeme *this;
  Type *ty;
  long lVar1;
  char *pcVar2;
  string local_38;
  
  if (param == (ParameterDeclarationSymbol *)0x0) {
    pcVar2 = "<Parameter is null>";
    lVar1 = 0x13;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"<Parameter |",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(os," name:",6);
    this = &ObjectDeclarationSymbol::name(&param->super_ObjectDeclarationSymbol)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_38,this);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_38._M_dataplus._M_p,local_38._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os," type:",6);
    ty = ObjectDeclarationSymbol::type(&param->super_ObjectDeclarationSymbol);
    operator<<(os,ty);
    pcVar2 = ">";
    lVar1 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const ParameterDeclarationSymbol* param)
{
    if (!param)
        return os << "<Parameter is null>";
    os << "<Parameter |";
    os << " name:" << param->name()->valueText();
    os << " type:" << param->type();
    os << ">";
    return os;
}